

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

void __thiscall rw::ColorQuant::makePalette(ColorQuant *this,int32 numColors,RGBA *colors)

{
  LinkList *pLVar1;
  uint uVar2;
  uint uVar3;
  LLLink *pLVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  LLLink *pLVar11;
  long lVar12;
  
  pLVar1 = &this->leaves;
  while( true ) {
    pLVar11 = &pLVar1->link;
    iVar9 = 0;
    do {
      iVar10 = iVar9;
      pLVar11 = ((LLLink *)&pLVar11->next)->next;
      iVar9 = iVar10 + 1;
    } while (pLVar11 != &pLVar1->link);
    pLVar11 = (pLVar1->link).next;
    if (iVar10 <= numColors) break;
    reduceNode(this,(Node *)pLVar11[-9].prev);
  }
  if (pLVar11 != &pLVar1->link) {
    lVar12 = 0;
    do {
      pLVar4 = pLVar11->next;
      uVar2 = *(uint *)&pLVar11[-9].next;
      uVar3 = *(uint *)((long)&pLVar11[-10].next + 4);
      uVar5 = (ulong)*(uint *)&pLVar11[-10].next / (ulong)uVar2;
      *(int *)&pLVar11[-10].next = (int)uVar5;
      uVar6 = (ulong)uVar3 / (ulong)uVar2;
      *(int *)((long)&pLVar11[-10].next + 4) = (int)uVar6;
      uVar7 = (ulong)*(uint *)&pLVar11[-10].prev / (ulong)uVar2;
      *(int *)&pLVar11[-10].prev = (int)uVar7;
      uVar8 = (ulong)*(uint *)((long)&pLVar11[-10].prev + 4) / (ulong)uVar2;
      *(int *)((long)&pLVar11[-10].prev + 4) = (int)uVar8;
      colors[lVar12].red = (uint8)uVar5;
      colors[lVar12].green = (uint8)uVar6;
      colors[lVar12].blue = (uint8)uVar7;
      colors[lVar12].alpha = (uint8)uVar8;
      *(int *)&pLVar11[-9].next = (int)lVar12;
      lVar12 = lVar12 + 1;
      pLVar11 = pLVar4;
    } while (pLVar4 != &pLVar1->link);
  }
  return;
}

Assistant:

void
ColorQuant::makePalette(int32 numColors, RGBA *colors)
{
	while(this->leaves.count() > numColors){
		Node *n = LLLinkGetData(this->leaves.link.next, Node, link);
		this->reduceNode(n->parent);
	}

	int i = 0;
	FORLIST(lnk, this->leaves){
		Node *n = LLLinkGetData(lnk, Node, link);
		n->r /= n->numPixels;
		n->g /= n->numPixels;
		n->b /= n->numPixels;
		n->a /= n->numPixels;
		colors[i].red = n->r;
		colors[i].green = n->g;
		colors[i].blue = n->b;
		colors[i].alpha = n->a;
		n->numPixels = i++;
	}
}